

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O1

uint32_t helper_servc(CPUS390XState_conflict *env,uint64_t r1,uint64_t r2)

{
  return 0;
}

Assistant:

uint32_t HELPER(servc)(CPUS390XState *env, uint64_t r1, uint64_t r2)
{
#if 0
    qemu_mutex_lock_iothread();
    int r = sclp_service_call(env, r1, r2);
    qemu_mutex_unlock_iothread();
    if (r < 0) {
        tcg_s390_program_interrupt(env, -r, GETPC());
    }
    return r;
#endif
    return 0;
}